

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O0

bool __thiscall
cmSourceGroupCommand::InitialPass
          (cmSourceGroupCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  cmSourceGroup *pcVar2;
  bool bVar3;
  uint uVar4;
  const_reference pvVar5;
  char *pcVar6;
  size_type sVar7;
  ulong uVar8;
  ostream *poVar9;
  string local_348;
  undefined1 local_328 [8];
  ostringstream err;
  string local_1b0;
  undefined1 local_190 [8];
  string src;
  string local_168;
  uint local_148;
  byte local_142;
  allocator local_141;
  uint i;
  bool doingFiles;
  cmSourceGroup *local_120;
  cmSourceGroup *sg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  folders;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  undefined1 local_a8 [8];
  string delimiter;
  undefined1 local_80 [8];
  string error;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmSourceGroupCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_00660e01;
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  bVar3 = std::operator==(pvVar5,"TREE");
  if (bVar3) {
    std::__cxx11::string::string((string *)local_80);
    this_local._7_1_ =
         processTree(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,(string *)local_80);
    if (!(bool)this_local._7_1_) {
      cmCommand::SetError(&this->super_cmCommand,(string *)local_80);
    }
    delimiter.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_80);
    goto LAB_00660e01;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a8,"\\",&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"SOURCE_GROUP_DELIMITER",&local_d1);
  pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  if (pcVar6 != (char *)0x0) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_f8,"SOURCE_GROUP_DELIMITER",
               (allocator *)
               ((long)&folders.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_f8);
    std::__cxx11::string::operator=((string *)local_a8,pcVar6);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&folders.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  cmSystemTools::tokenize
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sg,pvVar5,(string *)local_a8);
  local_120 = (cmSourceGroup *)0x0;
  local_120 = cmMakefile::GetSourceGroup
                        ((this->super_cmCommand).Makefile,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&sg);
  if (local_120 == (cmSourceGroup *)0x0) {
    cmMakefile::AddSourceGroup
              ((this->super_cmCommand).Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sg,(char *)0x0);
    local_120 = cmMakefile::GetSourceGroup
                          ((this->super_cmCommand).Makefile,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&sg);
  }
  if (local_120 == (cmSourceGroup *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i,"Could not create or find source group",&local_141);
    cmCommand::SetError(&this->super_cmCommand,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    this_local._7_1_ = 0;
    delimiter.field_2._12_4_ = 1;
  }
  else {
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar7 == 2) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,1);
      bVar3 = std::operator!=(pvVar5,"FILES");
      pcVar2 = local_120;
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local,1);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmSourceGroup::SetGroupRegex(pcVar2,pcVar6);
        this_local._7_1_ = 1;
        delimiter.field_2._12_4_ = 1;
        goto LAB_00660dcd;
      }
    }
    local_142 = 0;
    for (local_148 = 1; uVar8 = (ulong)local_148,
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local), uVar8 < sVar7; local_148 = local_148 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,(ulong)local_148);
      bVar3 = std::operator==(pvVar5,"REGULAR_EXPRESSION");
      if (bVar3) {
        uVar4 = local_148 + 1;
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
        pcVar2 = local_120;
        if (sVar7 <= uVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_168,"REGULAR_EXPRESSION argument given without a regex.",
                     (allocator *)(src.field_2._M_local_buf + 0xf));
          cmCommand::SetError(&this->super_cmCommand,&local_168);
          std::__cxx11::string::~string((string *)&local_168);
          std::allocator<char>::~allocator((allocator<char> *)(src.field_2._M_local_buf + 0xf));
          this_local._7_1_ = 0;
          delimiter.field_2._12_4_ = 1;
          goto LAB_00660dcd;
        }
        local_148 = local_148 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local,(ulong)local_148);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmSourceGroup::SetGroupRegex(pcVar2,pcVar6);
        local_142 = 0;
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_148);
        bVar3 = std::operator==(pvVar5,"FILES");
        if (bVar3) {
          local_142 = 1;
        }
        else {
          if ((local_142 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
            poVar9 = std::operator<<((ostream *)local_328,"Unknown argument \"");
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_148);
            poVar9 = std::operator<<(poVar9,(string *)pvVar5);
            poVar9 = std::operator<<(poVar9,"\".  ");
            std::operator<<(poVar9,"Perhaps the FILES keyword is missing.\n");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_348);
            std::__cxx11::string::~string((string *)&local_348);
            this_local._7_1_ = 0;
            delimiter.field_2._12_4_ = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
            goto LAB_00660dcd;
          }
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,(ulong)local_148);
          std::__cxx11::string::string((string *)local_190,(string *)pvVar5);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          bVar3 = cmsys::SystemTools::FileIsFullPath(pcVar6);
          if (!bVar3) {
            pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
            std::__cxx11::string::operator=((string *)local_190,pcVar6);
            std::__cxx11::string::operator+=((string *)local_190,"/");
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_148);
            std::__cxx11::string::operator+=((string *)local_190,(string *)pvVar5);
          }
          cmsys::SystemTools::CollapseFullPath(&local_1b0,(string *)local_190);
          std::__cxx11::string::operator=((string *)local_190,(string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          cmSourceGroup::AddGroupFile(local_120,(string *)local_190);
          std::__cxx11::string::~string((string *)local_190);
        }
      }
    }
    this_local._7_1_ = 1;
    delimiter.field_2._12_4_ = 1;
  }
LAB_00660dcd:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sg);
  std::__cxx11::string::~string((string *)local_a8);
LAB_00660e01:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSourceGroupCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  if (args[0] == "TREE") {
    std::string error;

    if (!processTree(args, error)) {
      this->SetError(error);
      return false;
    }

    return true;
  }

  std::string delimiter = "\\";
  if (this->Makefile->GetDefinition("SOURCE_GROUP_DELIMITER")) {
    delimiter = this->Makefile->GetDefinition("SOURCE_GROUP_DELIMITER");
  }

  std::vector<std::string> folders =
    cmSystemTools::tokenize(args[0], delimiter);

  cmSourceGroup* sg = CM_NULLPTR;
  sg = this->Makefile->GetSourceGroup(folders);
  if (!sg) {
    this->Makefile->AddSourceGroup(folders);
    sg = this->Makefile->GetSourceGroup(folders);
  }

  if (!sg) {
    this->SetError("Could not create or find source group");
    return false;
  }
  // If only two arguments are given, the pre-1.8 version of the
  // command is being invoked.
  if (args.size() == 2 && args[1] != "FILES") {
    sg->SetGroupRegex(args[1].c_str());
    return true;
  }

  // Process arguments.
  bool doingFiles = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "REGULAR_EXPRESSION") {
      // Next argument must specify the regex.
      if (i + 1 < args.size()) {
        ++i;
        sg->SetGroupRegex(args[i].c_str());
      } else {
        this->SetError("REGULAR_EXPRESSION argument given without a regex.");
        return false;
      }
      doingFiles = false;
    } else if (args[i] == "FILES") {
      // Next arguments will specify files.
      doingFiles = true;
    } else if (doingFiles) {
      // Convert name to full path and add to the group's list.
      std::string src = args[i];
      if (!cmSystemTools::FileIsFullPath(src.c_str())) {
        src = this->Makefile->GetCurrentSourceDirectory();
        src += "/";
        src += args[i];
      }
      src = cmSystemTools::CollapseFullPath(src);
      sg->AddGroupFile(src);
    } else {
      std::ostringstream err;
      err << "Unknown argument \"" << args[i] << "\".  "
          << "Perhaps the FILES keyword is missing.\n";
      this->SetError(err.str());
      return false;
    }
  }

  return true;
}